

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Vta2Gla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"vh"), iVar3 == 0x76) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 != -1) {
    Abc_Print(-2,"usage: &vta_gla [-vh]\n");
    Abc_Print(-2,"\t        maps variable- into fixed-time-frame gate-level abstraction\n");
    pcVar5 = "yes";
    if (!bVar2) {
      pcVar5 = "no";
    }
    Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar5);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    return 1;
  }
  pGVar1 = pAbc->pGia;
  if (pGVar1 == (Gia_Man_t *)0x0) {
    pcVar5 = "Abc_CommandAbc9Vta2Gla(): There is no AIG.\n";
  }
  else {
    if (pGVar1->vObjClasses != (Vec_Int_t *)0x0) {
      pVVar4 = pGVar1->vGateClasses;
      if (pVVar4 != (Vec_Int_t *)0x0) {
        if (pVVar4->pArray != (int *)0x0) {
          free(pVVar4->pArray);
          pGVar1->vGateClasses->pArray = (int *)0x0;
          pVVar4 = pGVar1->vGateClasses;
          if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0023e955;
        }
        free(pVVar4);
        pGVar1->vGateClasses = (Vec_Int_t *)0x0;
      }
LAB_0023e955:
      pVVar4 = Gia_VtaConvertToGla(pAbc->pGia,pAbc->pGia->vObjClasses);
      pGVar1 = pAbc->pGia;
      pGVar1->vGateClasses = pVVar4;
      pVVar4 = pGVar1->vObjClasses;
      if (pVVar4 == (Vec_Int_t *)0x0) {
        return 0;
      }
      if (pVVar4->pArray != (int *)0x0) {
        free(pVVar4->pArray);
        pGVar1->vObjClasses->pArray = (int *)0x0;
        pVVar4 = pGVar1->vObjClasses;
        if (pVVar4 == (Vec_Int_t *)0x0) {
          return 0;
        }
      }
      free(pVVar4);
      pGVar1->vObjClasses = (Vec_Int_t *)0x0;
      return 0;
    }
    pcVar5 = "Abc_CommandAbc9Vta2Gla(): There is no variable-time-frame abstraction is defined.\n";
  }
  Abc_Print(-1,pcVar5);
  return 0;
}

Assistant:

int Abc_CommandAbc9Vta2Gla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Vta2Gla(): There is no AIG.\n" );
        return 0;
    }
    if ( pAbc->pGia->vObjClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Vta2Gla(): There is no variable-time-frame abstraction is defined.\n" );
        return 0;
    }
    Vec_IntFreeP( &pAbc->pGia->vGateClasses );
    pAbc->pGia->vGateClasses = Gia_VtaConvertToGla( pAbc->pGia, pAbc->pGia->vObjClasses );
    Vec_IntFreeP( &pAbc->pGia->vObjClasses );
    return 0;

usage:
    Abc_Print( -2, "usage: &vta_gla [-vh]\n" );
    Abc_Print( -2, "\t        maps variable- into fixed-time-frame gate-level abstraction\n" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}